

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pcache1Rekey(sqlite3_pcache *p,sqlite3_pcache_page *pPg,uint iOld,uint iNew)

{
  uint uVar1;
  sqlite3_pcache_page *psVar2;
  long lVar3;
  ulong uVar4;
  void **ppvVar5;
  void **ppvVar6;
  
  uVar1 = *(uint *)(p + 0x30);
  ppvVar5 = (void **)(((ulong)iOld % (ulong)uVar1) * 8 + *(long *)(p + 0x38));
  do {
    ppvVar6 = ppvVar5;
    psVar2 = (sqlite3_pcache_page *)*ppvVar6;
    ppvVar5 = &psVar2[1].pExtra;
  } while (psVar2 != pPg);
  *ppvVar6 = pPg[1].pExtra;
  uVar4 = (ulong)iNew % (ulong)uVar1;
  *(uint *)&pPg[1].pBuf = iNew;
  lVar3 = *(long *)(p + 0x38);
  pPg[1].pExtra = *(void **)(lVar3 + uVar4 * 8);
  *(sqlite3_pcache_page **)(lVar3 + uVar4 * 8) = pPg;
  if (*(uint *)(p + 0x24) < iNew) {
    *(uint *)(p + 0x24) = iNew;
  }
  return;
}

Assistant:

static void pcache1Rekey(
  sqlite3_pcache *p,
  sqlite3_pcache_page *pPg,
  unsigned int iOld,
  unsigned int iNew
){
  PCache1 *pCache = (PCache1 *)p;
  PgHdr1 *pPage = (PgHdr1 *)pPg;
  PgHdr1 **pp;
  unsigned int h; 
  assert( pPage->iKey==iOld );
  assert( pPage->pCache==pCache );

  pcache1EnterMutex(pCache->pGroup);

  h = iOld%pCache->nHash;
  pp = &pCache->apHash[h];
  while( (*pp)!=pPage ){
    pp = &(*pp)->pNext;
  }
  *pp = pPage->pNext;

  h = iNew%pCache->nHash;
  pPage->iKey = iNew;
  pPage->pNext = pCache->apHash[h];
  pCache->apHash[h] = pPage;
  if( iNew>pCache->iMaxKey ){
    pCache->iMaxKey = iNew;
  }

  pcache1LeaveMutex(pCache->pGroup);
}